

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O1

void test_iterators_on_empty_simplex_tree<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>
               (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *tst)

{
  int iVar1;
  stored_size_type sVar2;
  pointer pvVar3;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar4;
  long *plVar5;
  Filtration_value *pFVar6;
  ostream *poVar7;
  long lVar8;
  pointer pvVar9;
  pointer ppVar10;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  local_120;
  is_before_in_totally_ordered_filtration local_108;
  undefined1 local_100;
  undefined8 *local_f8;
  char **local_f0;
  char *local_e8;
  char *local_e0;
  shared_count sStack_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"Iterator on vertices: ",0x16);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  sVar2 = (tst->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (sVar2 != 0) {
    ppVar10 = (tst->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    lVar8 = sVar2 * 0x18;
    do {
      if (ppVar10 == (pointer)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, true>::operator*() const [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, IsConst = true]"
                     );
      }
      iVar1 = ppVar10->first;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"vertice:",8);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::clog,iVar1);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      local_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
      ;
      local_38 = "";
      local_50 = &boost::unit_test::basic_cstring<char_const>::null;
      local_48 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3d,&local_50);
      local_120.sh_.m_ptr = local_120.sh_.m_ptr & 0xffffffffffffff00;
      local_120.sib_ = (Siblings *)0x0;
      local_120.st_ = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)0x0;
      local_e8 = "false";
      local_e0 = "";
      local_100 = 0;
      local_108.st_ =
           (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&PTR__lazy_ostream_001ce6b8
      ;
      local_f8 = &boost::unit_test::lazy_ostream::inst;
      local_f0 = &local_e8;
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
      ;
      local_58 = "";
      boost::test_tools::tt_detail::report_assertion(&local_120,&local_108,&local_60,0x3d,1,0,0);
      boost::detail::shared_count::~shared_count((shared_count *)&local_120.st_);
      ppVar10 = ppVar10 + 1;
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"Iterator on simplices: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  if ((tst->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0) {
    local_120.sib_ = (Siblings *)0x0;
    local_120.sh_.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)0x0;
    local_120.st_ = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)0x0;
  }
  else {
    local_120.sh_.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)(tst->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    local_120.st_ = tst;
    if (((((pointer)local_120.sh_.m_ptr)->second).children_)->parent_ ==
        ((pointer)local_120.sh_.m_ptr)->first) {
      do {
        local_120.sib_ = (((pointer)local_120.sh_.m_ptr)->second).children_;
        local_120.sh_.m_ptr =
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)((local_120.sib_)->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      } while (((((pointer)local_120.sh_.m_ptr)->second).children_)->parent_ ==
               ((pointer)local_120.sh_.m_ptr)->first);
    }
    else {
      local_120.sib_ = &tst->root_;
    }
  }
  if (local_120.st_ != (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)0x0) {
    do {
      local_70 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
      ;
      local_68 = "";
      local_80 = &boost::unit_test::basic_cstring<char_const>::null;
      local_78 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x41,&local_80);
      local_e8 = (char *)((ulong)local_e8 & 0xffffffffffffff00);
      local_e0 = (char *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_90 = "simplex != simplex";
      local_88 = "";
      local_100 = 0;
      local_108.st_ =
           (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&PTR__lazy_ostream_001ce6b8
      ;
      local_f8 = &boost::unit_test::lazy_ostream::inst;
      local_f0 = &local_90;
      local_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
      ;
      local_98 = "";
      boost::test_tools::tt_detail::report_assertion(&local_e8,&local_108,&local_a0,0x41,1,0,0);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      Gudhi::
      Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
      ::increment(&local_120);
    } while (local_120.st_ != (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "Iterator on Simplices in the filtration, with [filtration value]:",0x41);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  if ((tst->filtration_vect_).
      super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (tst->filtration_vect_).
      super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_108.st_ = tst;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
    initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>)_2_>
              (tst,&local_108,(anon_class_1_0_00000001 *)&local_120);
  }
  pvVar3 = (tst->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar9 = (tst->filtration_vect_).
                super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar3; pvVar9 = pvVar9 + 1) {
    ppVar4 = pvVar9->m_ptr;
    local_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_a8 = "";
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x48,&local_c0);
    local_120.sh_.m_ptr = local_120.sh_.m_ptr & 0xffffffffffffff00;
    local_120.sib_ = (Siblings *)0x0;
    local_120.st_ = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)0x0;
    local_e8 = "false";
    local_e0 = "";
    local_100 = 0;
    local_108.st_ =
         (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&PTR__lazy_ostream_001ce6b8;
    local_f8 = &boost::unit_test::lazy_ostream::inst;
    local_f0 = &local_e8;
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_c8 = "";
    boost::test_tools::tt_detail::report_assertion(&local_120,&local_108,&local_d0,0x48,1,0,0);
    boost::detail::shared_count::~shared_count((shared_count *)&local_120.st_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"test_iterators_on_empty_simplex_tree - filtration=",0x32);
    pFVar6 = (Filtration_value *)&ppVar4->second;
    if (ppVar4 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                   *)0x0) {
      pFVar6 = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
                Filtration_simplex_base_real::inf_;
    }
    poVar7 = std::ostream::_M_insert<double>
                       ((double)(((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                                   *)pFVar6)->super_Filtration_simplex_base).filt_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  return;
}

Assistant:

void test_iterators_on_empty_simplex_tree(const typeST& tst) {
  std::clog << "Iterator on vertices: " << std::endl;
  for (auto vertex : tst.complex_vertex_range()) {
    std::clog << "vertice:" << vertex << std::endl;
    BOOST_CHECK(false); // shall be empty
  }
  std::clog << "Iterator on simplices: " << std::endl;
  for (auto simplex : tst.complex_simplex_range()) {
    BOOST_CHECK(simplex != simplex); // shall be empty - to remove warning of non-used simplex
  }

  std::clog
      << "Iterator on Simplices in the filtration, with [filtration value]:"
      << std::endl;
  for (auto f_simplex : tst.filtration_simplex_range()) {
    BOOST_CHECK(false); // shall be empty
    std::clog << "test_iterators_on_empty_simplex_tree - filtration="
        << tst.filtration(f_simplex) << std::endl;
  }
}